

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O2

void __thiscall
ExprWriterTest_UnaryExprPrecedence_Test::TestBody(ExprWriterTest_UnaryExprPrecedence_Test *this)

{
  ExprBase arg;
  BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>
  arg_00;
  BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)25,_(mp::expr::Kind)38>
  arg_01;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *in_RCX;
  ExprFactory *this_00;
  char *pcVar1;
  AssertHelper local_58;
  AssertionResult gtest_ar;
  string local_40;
  
  this_00 = &(this->super_ExprWriterTest).super_ExprFactory;
  arg.impl_ = (Impl *)mp::BasicExprFactory<std::allocator<char>_>::MakeVariable(this_00,0);
  arg_00 = mp::BasicExprFactory<std::allocator<char>>::
           MakeUnary<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                     ((BasicExprFactory<std::allocator<char>> *)this_00,FIRST_UNARY,
                      (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)arg.impl_);
  local_58.data_ =
       (AssertHelperData *)
       mp::BasicExprFactory<std::allocator<char>>::
       MakeUnary<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                 ((BasicExprFactory<std::allocator<char>> *)this_00,FIRST_UNARY,
                  (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)
                  arg_00.super_BasicExpr<(mp::expr::Kind)4,_(mp::expr::Kind)24>.super_ExprBase.impl_
                 );
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (&local_40,(fmt *)0x14e4d3,(CStringRef)&local_58,in_RCX);
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"--x1\"",
             "fmt::format(\"{}\", static_cast<NumericExpr>(MakeUnary(ex::MINUS, MakeUnary(ex::MINUS, x1))))"
             ,(char (*) [5])"--x1",&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_40);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-writer-test.cc"
               ,0x1b2,pcVar1);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_40);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  arg_01 = mp::BasicExprFactory<std::allocator<char>>::
           MakeBinary<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                     ((BasicExprFactory<std::allocator<char>> *)this_00,POW,
                      (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)arg.impl_,
                      (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)arg.impl_);
  local_58.data_ =
       (AssertHelperData *)
       mp::BasicExprFactory<std::allocator<char>>::
       MakeUnary<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                 ((BasicExprFactory<std::allocator<char>> *)this_00,FIRST_UNARY,
                  (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)
                  arg_01.super_BasicExpr<(mp::expr::Kind)25,_(mp::expr::Kind)38>.super_ExprBase.
                  impl_);
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (&local_40,(fmt *)0x14e4d3,(CStringRef)&local_58,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)arg.impl_);
  testing::internal::CmpHelperEQ<char[11],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"-(x1 ^ x1)\"",
             "fmt::format(\"{}\", static_cast<NumericExpr>(MakeUnary(ex::MINUS, MakeBinary(ex::POW, x1, x1))))"
             ,(char (*) [11])"-(x1 ^ x1)",&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_40);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-writer-test.cc"
               ,0x1b3,pcVar1);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_40);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(ExprWriterTest, UnaryExprPrecedence) {
  auto x1 = MakeVariable(0);
  CHECK_WRITE("--x1", MakeUnary(ex::MINUS, MakeUnary(ex::MINUS, x1)));
  CHECK_WRITE("-(x1 ^ x1)", MakeUnary(ex::MINUS, MakeBinary(ex::POW, x1, x1)));
}